

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

int Gia_MuxDeref_rec(Gia_Man_t *p,int iObj)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  int iVar4;
  
  iVar4 = 0;
  while ((p->pMuxes != (uint *)0x0 && (p->pMuxes[iObj] != 0))) {
    pObj = Gia_ManObj(p,iObj);
    iVar2 = Gia_ObjId(p,pObj);
    piVar1 = p->pRefs + iVar2;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      return iVar4;
    }
    iVar2 = Gia_ObjFaninId0p(p,pObj);
    iVar2 = Gia_MuxDeref_rec(p,iVar2);
    iVar3 = Gia_ObjFaninId1p(p,pObj);
    iVar3 = Gia_MuxDeref_rec(p,iVar3);
    iObj = Gia_ObjFaninId2p(p,pObj);
    iVar4 = iVar4 + iVar3 + iVar2 + 1;
  }
  return iVar4;
}

Assistant:

int Gia_MuxDeref_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( !Gia_ObjIsMuxId(p, iObj) )
        return 0;
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjRefDec(p, pObj) )
        return 0;
    return Gia_MuxDeref_rec( p, Gia_ObjFaninId0p(p, pObj) ) + 
           Gia_MuxDeref_rec( p, Gia_ObjFaninId1p(p, pObj) ) + 
           Gia_MuxDeref_rec( p, Gia_ObjFaninId2p(p, pObj) ) + 1;
}